

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_wrapper.h
# Opt level: O1

iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> * __thiscall
date::iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++
          (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this)

{
  istreambuf_iterator<char,_std::char_traits<char>_> *piVar1;
  streambuf_type *psVar2;
  byte *pbVar3;
  value_type *pvVar4;
  size_t sVar5;
  int_type iVar6;
  int_type iVar7;
  uint uVar8;
  ulong uVar9;
  
  if ((this->m_position != 0xffffffffffffffff) &&
     (uVar9 = this->m_position + 1, this->m_position = uVar9, *this->m_cacheSize <= uVar9)) {
    piVar1 = this->m_srcEnd;
    iVar6 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(this->m_srcIt);
    iVar7 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(piVar1);
    if ((iVar6 == -1) == (iVar7 != -1)) {
      piVar1 = this->m_srcIt;
      psVar2 = piVar1->_M_sbuf;
      pbVar3 = *(byte **)(psVar2 + 0x10);
      if (pbVar3 < *(byte **)(psVar2 + 0x18)) {
        uVar8 = (uint)*pbVar3;
        *(byte **)(psVar2 + 0x10) = pbVar3 + 1;
      }
      else {
        uVar8 = (**(code **)(*(long *)psVar2 + 0x50))(psVar2);
      }
      piVar1->_M_c = -1;
      if ((psVar2 != (streambuf_type *)0x0) && (uVar8 == 0xffffffff)) {
        if (*(byte **)(psVar2 + 0x10) < *(byte **)(psVar2 + 0x18)) {
          uVar8 = (uint)**(byte **)(psVar2 + 0x10);
        }
        else {
          uVar8 = (**(code **)(*(long *)psVar2 + 0x48))(psVar2);
        }
      }
      pvVar4 = this->m_cache;
      sVar5 = *this->m_cacheSize;
      *this->m_cacheSize = sVar5 + 1;
      pvVar4[sVar5] = (value_type)uVar8;
    }
    else {
      this->m_position = 0xffffffffffffffff;
    }
  }
  return this;
}

Assistant:

iterator_proxy& operator++()
    {
        if ((m_position == static_cast<std::size_t>(-1)) || (++m_position < m_cacheSize))
            return *this;

        if (m_srcIt == m_srcEnd)
        {
            m_position = static_cast<std::size_t>(-1);
            return *this;
        }

        m_cache[m_cacheSize++] = *(m_srcIt++);
        return *this;
    }